

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nearest_neighbor.cc
# Opt level: O2

void __thiscall
features::NearestNeighbor<unsigned_short>::find
          (NearestNeighbor<unsigned_short> *this,unsigned_short *query,Result *result)

{
  short *psVar1;
  short *psVar2;
  ulong uVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ulong uVar14;
  
  result->index_2nd_best = 0;
  result->dist_1st_best = 0;
  result->dist_2nd_best = 0;
  result->index_1st_best = 0;
  lVar8 = *(long *)(this + 8);
  iVar7 = *(int *)(this + 4);
  uVar3 = (long)*(int *)this / 8 & 0xffffffff;
  iVar5 = 0;
  if ((int)((long)*(int *)this / 8) < 1) {
    uVar3 = 0;
  }
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  uVar10 = 0;
  uVar6 = 0;
  iVar9 = 0;
  while( true ) {
    uVar4 = (ushort)uVar10;
    if (iVar9 == iVar7) break;
    uVar15 = 0;
    uVar16 = 0;
    uVar17 = 0;
    uVar18 = 0;
    uVar19 = 0;
    uVar20 = 0;
    uVar21 = 0;
    uVar22 = 0;
    lVar12 = 0;
    uVar14 = uVar3;
    while (iVar13 = (int)uVar14, uVar14 = (ulong)(iVar13 - 1), iVar13 != 0) {
      psVar1 = (short *)(lVar8 + lVar12);
      psVar2 = (short *)((long)query + lVar12);
      uVar15 = uVar15 + *psVar1 * *psVar2;
      uVar16 = uVar16 + psVar1[1] * psVar2[1];
      uVar17 = uVar17 + psVar1[2] * psVar2[2];
      uVar18 = uVar18 + psVar1[3] * psVar2[3];
      uVar19 = uVar19 + psVar1[4] * psVar2[4];
      uVar20 = uVar20 + psVar1[5] * psVar2[5];
      uVar21 = uVar21 + psVar1[6] * psVar2[6];
      uVar22 = uVar22 + psVar1[7] * psVar2[7];
      lVar12 = lVar12 + 0x10;
    }
    uVar11 = (uint)uVar22 +
             (uint)uVar21 + (uint)uVar20 + (uint)uVar19 +
             (uint)uVar18 + (uint)uVar17 + (uint)uVar16 + (uint)uVar15;
    if ((uVar6 & 0xffff) <= uVar11) {
      if (uVar11 < (uVar10 & 0xffff)) {
        result->index_2nd_best = iVar9;
        result->dist_2nd_best = (unsigned_short)uVar11;
        uVar6 = uVar11;
      }
      else {
        result->index_2nd_best = iVar5;
        result->dist_2nd_best = uVar4;
        result->index_1st_best = iVar9;
        result->dist_1st_best = (unsigned_short)uVar11;
        iVar5 = iVar9;
        uVar6 = uVar10;
        uVar10 = uVar11;
      }
    }
    lVar8 = lVar8 + uVar3 * 0x10;
    iVar9 = iVar9 + 1;
  }
  uVar15 = -uVar4 - 0x1ff;
  if (0xfe01 < uVar4) {
    uVar15 = 0;
  }
  uVar4 = -(ushort)uVar6 - 0x1ff;
  if (0xfe01 < (ushort)uVar6) {
    uVar4 = 0;
  }
  if (0x7ffe < uVar15) {
    uVar15 = 0x7fff;
  }
  result->dist_1st_best = uVar15 * 2;
  if (0x7ffe < uVar4) {
    uVar4 = 0x7fff;
  }
  result->dist_2nd_best = uVar4 * 2;
  return;
}

Assistant:

void
NearestNeighbor<unsigned short>::find (unsigned short const* query,
    NearestNeighbor<unsigned short>::Result* result) const
{
    /* Result distances are shamelessly misused to store inner products. */
    result->dist_1st_best = 0;
    result->dist_2nd_best = 0;
    result->index_1st_best = 0;
    result->index_2nd_best = 0;

    short_inner_prod<unsigned short>(query, result, this->elements,
        this->num_elements, this->dimensions);

    /*
     * Compute actual square distances.
     * The distance with 'unsigned char' vectors is: 2 * 255^2 - 2 * <Q, Ci>.
     * The maximum distance is (2*255)^2, which unfortunately does not fit
     * in a unsigned short. Therefore, the result distance is clapmed:
     * 2 * 255^2 - 2 * <Q, Ci> = 2 * (255^2 - <Q, Ci>) and (255^2 - <Q, Ci>)
     * is clamped to 32767 and then multiplied by 2.
     */
    result->dist_1st_best = std::min(65025, (int)result->dist_1st_best);
    result->dist_2nd_best = std::min(65025, (int)result->dist_2nd_best);
    result->dist_1st_best = 65025 - result->dist_1st_best;
    result->dist_2nd_best = 65025 - result->dist_2nd_best;
    result->dist_1st_best = std::min(32767, (int)result->dist_1st_best) * 2;
    result->dist_2nd_best = std::min(32767, (int)result->dist_2nd_best) * 2;
}